

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_fluent.cpp
# Opt level: O1

void __thiscall
icu_63::number::LocalizedNumberFormatter::lnfMoveHelper(LocalizedNumberFormatter *this,LNF *src)

{
  NumberFormatterImpl *this_00;
  LNF *p;
  
  this->fUnsafeCallCount[0] = '\0';
  this->fUnsafeCallCount[1] = '\0';
  this->fUnsafeCallCount[2] = '\0';
  this->fUnsafeCallCount[3] = -0x80;
  this_00 = this->fCompiled;
  if (this_00 != (NumberFormatterImpl *)0x0) {
    p = src;
    impl::NumberFormatterImpl::~NumberFormatterImpl(this_00);
    UMemory::operator_delete((UMemory *)this_00,p);
  }
  this->fCompiled = src->fCompiled;
  src->fUnsafeCallCount[0] = '\0';
  src->fUnsafeCallCount[1] = '\0';
  src->fUnsafeCallCount[2] = '\0';
  src->fUnsafeCallCount[3] = '\0';
  src->fCompiled = (NumberFormatterImpl *)0x0;
  return;
}

Assistant:

void LocalizedNumberFormatter::lnfMoveHelper(LNF&& src) {
    // Copy over the compiled formatter and set call count to INT32_MIN as in computeCompiled().
    // Don't copy the call count directly because doing so requires a loadAcquire/storeRelease.
    // The bits themselves appear to be platform-dependent, so copying them might not be safe.
    auto* callCount = reinterpret_cast<u_atomic_int32_t*>(fUnsafeCallCount);
    umtx_storeRelease(*callCount, INT32_MIN);
    delete fCompiled;
    fCompiled = src.fCompiled;
    // Reset the source object to leave it in a safe state.
    auto* srcCallCount = reinterpret_cast<u_atomic_int32_t*>(src.fUnsafeCallCount);
    umtx_storeRelease(*srcCallCount, 0);
    src.fCompiled = nullptr;
}